

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,void *data,
           int alpha,int pad,char *fmt,...)

{
  char cVar1;
  uchar a;
  byte bVar2;
  int iVar3;
  char in_AL;
  FILE *__s;
  undefined2 *puVar4;
  byte *pbVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uchar c;
  uchar b_00;
  void *pvVar8;
  long lVar9;
  uchar *puVar10;
  long lVar11;
  ulong uVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t sStack_150;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  long local_90;
  ulong local_88;
  void *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  va_list v;
  uchar local_37 [3];
  undefined4 local_34;
  uchar px [3];
  uchar b [2];
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    return 0;
  }
  __s = fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    local_60 = CONCAT44(local_60._4_4_,comp);
    v[0].overflow_arg_area = local_148;
    v[0]._0_8_ = &stack0x00000030;
    local_58 = 0x3000000030;
LAB_00106cec:
    do {
      cVar1 = *fmt;
      if (cVar1 == '\0') goto LAB_00106dba;
      fmt = fmt + 1;
      if (cVar1 != ' ') {
        if (cVar1 == '4') {
          uVar7 = local_58 & 0xffffffff;
          if (uVar7 < 0x29) {
            local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
            puVar6 = (undefined4 *)(uVar7 + (long)v[0].overflow_arg_area);
          }
          else {
            puVar6 = (undefined4 *)v[0]._0_8_;
            v[0]._0_8_ = v[0]._0_8_ + 8;
          }
          local_34 = *puVar6;
          sStack_150 = 4;
        }
        else {
          if (cVar1 != '2') {
            if (cVar1 != '1') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                            ,0x92,"void writefv(FILE *, const char *, __va_list_tag *)");
            }
            uVar7 = local_58 & 0xffffffff;
            if (uVar7 < 0x29) {
              local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
              pbVar5 = (byte *)(uVar7 + (long)v[0].overflow_arg_area);
            }
            else {
              pbVar5 = (byte *)v[0]._0_8_;
              v[0]._0_8_ = v[0]._0_8_ + 8;
            }
            fputc((uint)*pbVar5,__s);
            goto LAB_00106cec;
          }
          uVar7 = local_58 & 0xffffffff;
          if (uVar7 < 0x29) {
            local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
            puVar4 = (undefined2 *)(uVar7 + (long)v[0].overflow_arg_area);
          }
          else {
            puVar4 = (undefined2 *)v[0]._0_8_;
            v[0]._0_8_ = v[0]._0_8_ + 8;
          }
          local_34 = CONCAT22(local_34._2_2_,*puVar4);
          sStack_150 = 2;
        }
        fwrite(&local_34,sStack_150,1,__s);
      }
    } while( true );
  }
LAB_00106f3f:
  return (uint)(__s != (FILE *)0x0);
LAB_00106dba:
  local_34 = 0;
  v[0].reg_save_area = __s;
  if (0 < y) {
    iVar3 = (int)local_60;
    lVar11 = (long)(int)local_60;
    local_78 = (ulong)(uint)pad;
    local_60 = 0;
    if (0 < x) {
      local_60 = (ulong)(uint)x;
    }
    local_70 = (long)x;
    pvVar8 = (void *)(((ulong)(uint)y - 1) * lVar11 * local_70 + (long)data);
    local_68 = -(lVar11 * local_70);
    uVar7 = (ulong)(uint)y;
    while (uVar7 != 0) {
      local_90 = (uVar7 - 1) * local_70;
      local_88 = uVar7 - 1;
      local_80 = pvVar8;
      for (uVar12 = 0; uVar12 != local_60; uVar12 = uVar12 + 1) {
        puVar10 = (uchar *)((uVar12 + local_90) * lVar11 + (long)data);
        switch(iVar3) {
        case 1:
          c = *puVar10;
LAB_00106e9d:
          fputc((int)(char)c,(FILE *)v[0].reg_save_area);
          break;
        case 2:
          c = *puVar10;
          b_00 = c;
          a = c;
          if (expand_mono == 0) goto LAB_00106e9d;
          goto LAB_00106e96;
        case 4:
          if (alpha == 0) {
            bVar2 = puVar10[3];
            for (lVar9 = 0; c = local_37[0], b_00 = local_37[1], a = local_37[2], lVar9 != 3;
                lVar9 = lVar9 + 1) {
              local_37[lVar9] =
                   (char)((int)(((uint)*(byte *)((long)pvVar8 + lVar9) -
                                (uint)(byte)(&DAT_0010e1b4)[lVar9]) * (uint)bVar2) / 0xff) +
                   (&DAT_0010e1b4)[lVar9];
            }
            goto LAB_00106e96;
          }
        case 3:
          c = *puVar10;
          b_00 = puVar10[1];
          a = puVar10[2];
LAB_00106e96:
          write3((FILE *)v[0].reg_save_area,a,b_00,c);
        }
        if (0 < alpha) {
          fputc((int)(char)puVar10[lVar11 + -1],(FILE *)v[0].reg_save_area);
        }
        pvVar8 = (void *)((long)pvVar8 + lVar11);
      }
      fwrite(&local_34,local_78,1,(FILE *)v[0].reg_save_area);
      pvVar8 = (void *)((long)local_80 + local_68);
      uVar7 = local_88;
    }
  }
  __s = (FILE *)v[0].reg_save_area;
  fclose((FILE *)v[0].reg_save_area);
  goto LAB_00106f3f;
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   FILE *f;
   if (y < 0 || x < 0) return 0;
   f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad,expand_mono);
      fclose(f);
   }
   return f != NULL;
}